

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseExtKR_ParameterDeclaration
          (Parser *this,ExtKR_ParameterDeclarationSyntax **paramDecl)

{
  DeclaratorListSyntax *pDVar1;
  bool bVar2;
  ExtKR_ParameterDeclarationSyntax *pEVar3;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *pSVar4;
  SyntaxToken *pSVar5;
  IndexType IVar6;
  DeclaratorListSyntax **ppDVar7;
  DeclaratorSyntax *decltor;
  SpecifierListSyntax *specList;
  DeclarationSyntax *decl;
  
  decl = (DeclarationSyntax *)0x0;
  specList = (SpecifierListSyntax *)0x0;
  bVar2 = parseDeclarationSpecifiers(this,&decl,&specList,Unspecified);
  if (bVar2) {
    pEVar3 = makeNode<psy::C::ExtKR_ParameterDeclarationSyntax>(this);
    *paramDecl = pEVar3;
    pEVar3->specs_ = specList;
    ppDVar7 = &(*paramDecl)->decltors_;
    while( true ) {
      decltor = (DeclaratorSyntax *)0x0;
      bVar2 = parseDeclarator(this,&decltor,Parameter);
      if (!bVar2) break;
      pSVar4 = makeNode<psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>,psy::C::DeclaratorSyntax*&>
                         (this,&decltor);
      *ppDVar7 = pSVar4;
      pSVar5 = peek(this,1);
      if (pSVar5->syntaxK_ != CommaToken) {
        if (pSVar5->syntaxK_ != SemicolonToken) {
          return false;
        }
        IVar6 = consume(this);
        (*paramDecl)->semicolonTkIdx_ = IVar6;
        return true;
      }
      IVar6 = consume(this);
      pDVar1 = *ppDVar7;
      pDVar1->delimTkIdx_ = (uint)IVar6;
      ppDVar7 = &(pDVar1->
                 super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                 ).
                 super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                 .next;
    }
  }
  return false;
}

Assistant:

bool Parser::parseExtKR_ParameterDeclaration(ExtKR_ParameterDeclarationSyntax*& paramDecl)
{
    DBG_THIS_RULE();

    DeclarationSyntax* decl = nullptr;
    SpecifierListSyntax* specList = nullptr;
    if (!parseDeclarationSpecifiers(decl, specList, DeclarationContext::Unspecified))
        return false;

    paramDecl = makeNode<ExtKR_ParameterDeclarationSyntax>();
    paramDecl->specs_ = specList;

    DeclaratorListSyntax** decltorList_cur = &paramDecl->decltors_;
    while (true) {
        DeclaratorSyntax* decltor = nullptr;
        if (!parseDeclarator(decltor, DeclarationContext::Parameter))
            return false;

        *decltorList_cur = makeNode<DeclaratorListSyntax>(decltor);
        switch (peek().kind()) {
            case SyntaxKind::CommaToken:
                (*decltorList_cur)->delimTkIdx_ = consume();
                decltorList_cur = &(*decltorList_cur)->next;
                break;

            case SyntaxKind::SemicolonToken:
                paramDecl->semicolonTkIdx_ = consume();
                return true;

            default:
                return false;
        }
    }
}